

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<unsigned_long,signed_char>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<unsigned_long,_signed_char,_4> TVar3;
  string msg_2;
  unsigned_long x;
  string msg_1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  unsigned_long ret;
  TestCase<unsigned_long,_signed_char,_4> test;
  TestVector<unsigned_long,_signed_char,_4> tests;
  char *in_stack_fffffffffffffd88;
  allocator *in_stack_fffffffffffffd90;
  TestVector<unsigned_long,_signed_char,_4> *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  unsigned_long local_220;
  undefined2 local_218;
  allocator local_1f9;
  string local_1f8 [14];
  undefined1 in_stack_fffffffffffffe16;
  char in_stack_fffffffffffffe17;
  unsigned_long in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  string local_190 [39];
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_169;
  unsigned_long local_168;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_d0;
  byte local_c2;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [40];
  TestCase<unsigned_long,_signed_char,_4> local_40;
  unsigned_long local_30;
  undefined2 local_28;
  TestVector<unsigned_long,_signed_char,_4> local_20;
  
  TestVector<unsigned_long,_signed_char,_4>::TestVector(&local_20);
  TVar3 = TestVector<unsigned_long,_signed_char,_4>::GetNext(in_stack_fffffffffffffd98);
  local_40.x = TVar3.x;
  local_30 = local_40.x;
  local_40._8_2_ = TVar3._8_2_;
  local_28._0_1_ = local_40.y;
  local_28._1_1_ = local_40.fExpected;
  local_40 = TVar3;
  while( true ) {
    bVar1 = TestVector<unsigned_long,_signed_char,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<unsigned_long,signed_char>
                      ((unsigned_long)in_stack_fffffffffffffd90,
                       (char)((ulong)in_stack_fffffffffffffd88 >> 0x38),(unsigned_long *)0x1b74b0);
    if (bVar1 != (bool)(local_28._1_1_ & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Error in case ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
      err_msg<unsigned_long,signed_char>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,
                 (bool)in_stack_fffffffffffffe16);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_68);
    }
    local_c2 = 1;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_d0,&local_30);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffd90,(char)((ulong)in_stack_fffffffffffffd88 >> 0x38));
    if ((local_c2 & 1) != (local_28._1_1_ & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"Error in case ",&local_131);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      in_stack_fffffffffffffda0 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,in_stack_fffffffffffffda0,&local_159);
      err_msg<unsigned_long,signed_char>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,
                 (bool)in_stack_fffffffffffffe16);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string(local_f0);
    }
    local_c2 = 1;
    local_168 = local_30;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_169,(char *)&local_28);
    operator-=((unsigned_long *)in_stack_fffffffffffffd98,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(char)((ulong)in_stack_fffffffffffffda0 >> 0x38));
    if ((local_c2 & 1) != (local_28._1_1_ & 1)) {
      in_stack_fffffffffffffd98 = (TestVector<unsigned_long,_signed_char,_4> *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1d1 + 1),"Error in case ",(allocator *)in_stack_fffffffffffffd98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
      in_stack_fffffffffffffd88 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd90 = &local_1f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
      err_msg<unsigned_long,signed_char>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,
                 (bool)in_stack_fffffffffffffe16);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string(local_190);
    }
    TVar3 = TestVector<unsigned_long,_signed_char,_4>::GetNext(in_stack_fffffffffffffd98);
    local_220 = TVar3.x;
    local_218 = TVar3._8_2_;
    local_30 = local_220;
    local_28 = local_218;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}